

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packingvectors.h
# Opt level: O0

uint32_t *
FastPForLib::packingvector<32U>::packmeuptightwithoutmask<unsigned_long>
          (unsigned_long *source,size_t size,uint32_t *out,uint32_t bit)

{
  uint in_ECX;
  undefined4 *in_RDX;
  uint64_t *in_RSI;
  uint32_t j;
  uint local_20;
  uint32_t *out_00;
  
  *in_RDX = (int)in_RSI;
  out_00 = in_RDX + 1;
  for (local_20 = 0; (uint64_t *)(ulong)local_20 < in_RSI; local_20 = local_20 + 0x20) {
    fastpackwithoutmask(in_RSI,out_00,in_ECX);
    out_00 = out_00 + in_ECX;
  }
  return out_00 + -(((ulong)local_20 - (long)in_RSI) * (ulong)in_ECX >> 5);
}

Assistant:

static uint32_t *packmeuptightwithoutmask(
                                            const IntType * source,
                                            size_t size,
                                            uint32_t *out,
                                            const uint32_t bit) {
    *out = static_cast<uint32_t>(size);
    out++;
    uint32_t j = 0;
    for (; j < size; j += PACKSIZE) {
      fastpackwithoutmask(&source[j], out, bit);
      out += bit;
    }
    out -= (j - size) * bit / 32;
    return out;
  }